

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_temporary_files.cpp
# Opt level: O3

void duckdb::DuckDBTemporaryFilesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  idx_t iVar1;
  GlobalTableFunctionState *pGVar2;
  pointer pcVar3;
  reference pvVar4;
  long value;
  _func_int **__n;
  ulong index;
  bool bVar5;
  string local_90;
  Value local_70;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar2 = (data_p->global_state).ptr;
  __n = pGVar2[4]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)
            (((long)pGVar2[2]._vptr_GlobalTableFunctionState -
              (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 3) * -0x3333333333333333)) {
    index = 0;
    do {
      pGVar2[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar4 = vector<duckdb::TemporaryFileInformation,_true>::operator[]
                         ((vector<duckdb::TemporaryFileInformation,_true> *)(pGVar2 + 1),
                          (size_type)__n);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar3 = (pvVar4->path)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar3,pcVar3 + (pvVar4->path)._M_string_length);
      Value::Value(&local_70,&local_90);
      DataChunk::SetValue(output,0,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      value = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar4->size);
      Value::BIGINT(&local_70,value);
      DataChunk::SetValue(output,1,index,&local_70);
      Value::~Value(&local_70);
      iVar1 = index + 1;
      __n = pGVar2[4]._vptr_GlobalTableFunctionState;
    } while ((__n < (_func_int **)
                    (((long)pGVar2[2]._vptr_GlobalTableFunctionState -
                      (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 3) * -0x3333333333333333))
            && (bVar5 = index < 0x7ff, index = iVar1, bVar5));
    output->count = iVar1;
  }
  return;
}

Assistant:

void DuckDBTemporaryFilesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBTemporaryFilesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++];
		// return values:
		idx_t col = 0;
		// database_name, VARCHAR
		output.SetValue(col++, count, entry.path);
		// database_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(entry.size)));
		count++;
	}
	output.SetCardinality(count);
}